

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void machao(dw_rom *rom)

{
  dw_rom *rom_local;
  
  set_npc_palette(rom,NPC_RED_GUARD,'\x01');
  vpatch(rom,0x13b4,0x50,0x34,3,0x4a,3,0x35,3,0x4b,3,0x36,3,0x4e,3,0x37,3,0x4f,3,0x48,3,0x4a,3,0x49,
         3,0x4b,3,0x4c,3,0x4e,3,0x4d,3,0x4f,3,0x34,3,0x4a,3,0x35,3,0x4b,3,0x36,3,0x4e,3,0x37,3,0x4f,
         3,0x48,3,0x4a,3,0x49,3,0x4b,3,0x4c,3,0x4e,3,0x4d,3,0x4f,3,0xa5,0x43);
  vpatch(rom,0x14b4,0x4e,0x50,3,0x26,3,0x51,3,0x27,3,0x54,3,0x28,3,0x55,3,0x29,3,0x50,3,0x52,3,0x51,
         3,0x53,3,0x54,3,0x56,3,0x55,3,0x57,3,0x50,3,0x26,3,0x51,3,0x27,3,0x54,3,0x28,3,0x55,3,0x29,
         3,0x50,3,0x52,3,0x51,3,0x53,3,0x54,3,0x56,3,0x55,3,0x57,3,0xb9,3);
  vpatch(rom,0x15b4,0x4c,0x30,3,0x42,3,0x31,3,0x43,3,0x32,3,0x46,3,0x33,3,0x47,3,0x40,3,0x42,3,0x41,
         3,0x43,3,0x44,3,0x46,3,0x45,3,0x47,3,0x30,3,0x42,3,0x31,3,0x43,3,0x32,3,0x46,3,0x33,3,0x47,
         3,0x40,3,0x42,3,0x41,3,0x43,3,0x44,3,0x46,3,0x45,3,0x47,3,0xb4,3);
  vpatch(rom,0x16b4,0x4c,0x26,0x43,0x50,0x43,0x27,0x43,0x51,0x43,0x28,0x43,0x54,0x43,0x29,0x43,0x55,
         0x43,0x52,0x43,0x50,0x43,0x53,0x43,0x51,0x43,0x56,0x43,0x54,0x43,0x57,0x43,0x55,0x43,0x26,
         0x43,0x50,0x43,0x27,0x43,0x51,0x43,0x28,0x43,0x54,0x43,0x29,0x43,0x55,0x43,0x52,0x43,0x50,
         0x43,0x53,0x43,0x51,0x43,0x56,0x43,0x54,0x43,0x57,0x43,0x55,0x43,0xbc,3);
  vpatch(rom,0x1a94,3,0x30,0x36,0x15);
  vpatch(rom,0x12180,0x80,7,0x1f,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,3,0xf,0xf,0x1f,0x1f,0x1f,0x1f,0x1f,7,7
         ,7,0xf,0xf,2,2,0,2,1,6,0xf,0xf,7,7,7,0x1f,0x1f,0xf,7,0xf,0x1f,0x1f,0x3f,0x2f,0x27,0x10,7,2,
         2,4,4,0xf8,0xf8,0xf0,0xe0,0xf0,0xf8,0xf8,0xf8,0xf0,0xe4,0xc,0xec,0x4c,0x20,0x20,0x10,0x78,
         0x7c);
  vpatch(rom,0x12220,0x20,7,0xf,0x1f,0x1f,0x1f,0xf,7,0x38,7,0xf,0x1f,7,0x18,0x1f,0xf,0x3f,0xc,0x18,
         0x18,0x18,0x1c,0xf,0xf,0,0xf,0x1f,0x1f,7,0x1f,0xf,0,0);
  vpatch(rom,0x12260,800,0xe0,0xf0,0xe8,0x80,0xc0,0x40,0,0,0xe0,0xf0,0x48,0xe0,0xe0,0xe0,0xe0,0xe0,
         0xe0,0x20,0x20,0x20,0xe0,0xe0,0xe0,0,0xe0,0xc0,0xd8,0xf8,0,0xe0,0xe0,0xc0,0xe8,0xf0,0xe0,
         0x80,0xc0,0x40,0,0,0xe8,0xf0,0x40,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,
         0xe0,0x80,0xfc,0x1c,0,0xe0,0,0xe0,0xf8,0xf0,0x3f,0x3f);
  vpatch(rom,0x12700,0x10,3,7,7,7,7,6,0x1a,0x38,1,1,5,5,0,7,0x1f,0x1f);
  vpatch(rom,0x12720,0x10,0xc0,0xe0,0xe0,0xe0,0xe0,0x60,0x58,0x1c,0x80,0x80,0xa0,0xa0,0,0xe0,0xf8,
         0xfc);
  vpatch(rom,0x12740,0x10,0x1c,0x1f,0x3f,0x1f,0xf,0xf,0xf,3,0x6f,0x6f,0x27,8,0xd,8,0xd,0xd);
  vpatch(rom,0x12760,0x10,0x3c,0xfe,0xfe,0xfc,0xf0,0xf0,0xc0,0,0xf8,0xf8,0xd2,0x36,0xf0,0x70,0xf8,
         0x70);
  vpatch(rom,0x12880,0x40,3,7,7,7,7,6,0x1a,0x38,1,1,5,5,0,7,0x1f,0x3f,0xc0,0xe0,0xe0,0xe0,0xe0,0x60,
         0x58,0x1c,0x80,0x80,0xa0,0xa0,0,0xe0,0xf8,0xf8,0x3c,0x7f,0x7f,0x3f,0xf,0xf,3,0,0x1f,0x1f,
         0x4b,0x6c,0xf,0xe,0x1f,0xe,0x38,0xf8,0xfc,0xf8,0xf0,0xf0,0xf0,0xc0,0xf6,0xf6,0xe4,0x10,0xb0
         ,0x10,0xb0,0xb0);
  vpatch(rom,0x12a20,0xe0,0xff,0xff,0x7f,0xc,0x1b,0xf,7,0,0xe0,0xf8,0x7e,0xf,0x1f,0xf,7,0xe,0xfe,
         0xff,0xff,0x1f,0xef,0xf0,0x80,0,6,0xf,0x3f,0xf0,0xf8,0xf0,0xf0,0,0x2a,0x7f,0xff,0xdf,0xcf,
         0x9f,0xff,0xff,0x2a,0x7f,0xff,0xff,0xff,0xef,0x80,0xc0,8,0xe6,0xf3,0xf3,0xf2,0xec,0xf8,0xfe
         ,8,0xe6,0xf3,0xf3,0xf2,0xfc,0,0,0xff,0xff);
  vpatch(rom,0x12b20,0x100,0xfe,0x78,0x1f,0xf,0xf,0,3,0,0xe3,0x67,0x30,0x18,1,3,3,0,0x7e,0x7f,0xff,
         0x9f,0xff,0x7e,0xfe,0x1e,0xe3,0xd1,0x4c,0xe2,0xf2,0x90,0xa0,0x1e,0x3e,0x7f,0xff,0xff,0xfd,
         0xf5,0xe5,0xf1,0x34,0x59,0xe7,0xdf,0xff,0xff,0xff,0xff,0x42,0xfc,0xfe,0x76,0xdf,0x7a,0x4a,3
         ,0x42,0xfc,0xfe,0xfe,0xff,0xff,0xfe,0xfe,0xfe,0x78);
  if ((rom->flags[0xe] & 8) != 0) {
    set_text(rom,0x7e56,anon_var_dwarf_814);
    set_text(rom,0x8774,"TuiLu");
  }
  return;
}

Assistant:

static void machao(dw_rom *rom)
{
    set_npc_palette(rom, NPC_RED_GUARD, 1);
    vpatch(rom, 0x013b4,  80, 0x34, 0x03, 0x4A, 0x03, 0x35, 0x03, 0x4B, 0x03, 0x36, 0x03, 0x4E, 0x03, 0x37, 0x03, 0x4F, 0x03, 0x48, 0x03, 0x4A, 0x03, 0x49, 0x03, 0x4B, 0x03, 0x4C, 0x03, 0x4E, 0x03, 0x4D, 0x03, 0x4F, 0x03, 0x34, 0x03, 0x4A, 0x03, 0x35, 0x03, 0x4B, 0x03, 0x36, 0x03, 0x4E, 0x03, 0x37, 0x03, 0x4F, 0x03, 0x48, 0x03, 0x4A, 0x03, 0x49, 0x03, 0x4B, 0x03, 0x4C, 0x03, 0x4E, 0x03, 0x4D, 0x03, 0x4F, 0x03, 0xA5, 0x43, 0xA4, 0x43, 0xA3, 0x43, 0xA2, 0x43, 0xAC, 0x43, 0xA8, 0x43, 0xA7, 0x43, 0xA6, 0x43);
    vpatch(rom, 0x014b4,  78, 0x50, 0x03, 0x26, 0x03, 0x51, 0x03, 0x27, 0x03, 0x54, 0x03, 0x28, 0x03, 0x55, 0x03, 0x29, 0x03, 0x50, 0x03, 0x52, 0x03, 0x51, 0x03, 0x53, 0x03, 0x54, 0x03, 0x56, 0x03, 0x55, 0x03, 0x57, 0x03, 0x50, 0x03, 0x26, 0x03, 0x51, 0x03, 0x27, 0x03, 0x54, 0x03, 0x28, 0x03, 0x55, 0x03, 0x29, 0x03, 0x50, 0x03, 0x52, 0x03, 0x51, 0x03, 0x53, 0x03, 0x54, 0x03, 0x56, 0x03, 0x55, 0x03, 0x57, 0x03, 0xB9, 0x03, 0xA9, 0x03, 0xAA, 0x03, 0xAB, 0x03, 0xBD, 0x03, 0xAD, 0x03, 0xAE, 0x03);
    vpatch(rom, 0x015b4,  76, 0x30, 0x03, 0x42, 0x03, 0x31, 0x03, 0x43, 0x03, 0x32, 0x03, 0x46, 0x03, 0x33, 0x03, 0x47, 0x03, 0x40, 0x03, 0x42, 0x03, 0x41, 0x03, 0x43, 0x03, 0x44, 0x03, 0x46, 0x03, 0x45, 0x03, 0x47, 0x03, 0x30, 0x03, 0x42, 0x03, 0x31, 0x03, 0x43, 0x03, 0x32, 0x03, 0x46, 0x03, 0x33, 0x03, 0x47, 0x03, 0x40, 0x03, 0x42, 0x03, 0x41, 0x03, 0x43, 0x03, 0x44, 0x03, 0x46, 0x03, 0x45, 0x03, 0x47, 0x03, 0xB4, 0x03, 0xB5, 0x03, 0xB2, 0x03, 0xB3, 0x03, 0xB4, 0x03, 0xB8, 0x03);
    vpatch(rom, 0x016b4,  76, 0x26, 0x43, 0x50, 0x43, 0x27, 0x43, 0x51, 0x43, 0x28, 0x43, 0x54, 0x43, 0x29, 0x43, 0x55, 0x43, 0x52, 0x43, 0x50, 0x43, 0x53, 0x43, 0x51, 0x43, 0x56, 0x43, 0x54, 0x43, 0x57, 0x43, 0x55, 0x43, 0x26, 0x43, 0x50, 0x43, 0x27, 0x43, 0x51, 0x43, 0x28, 0x43, 0x54, 0x43, 0x29, 0x43, 0x55, 0x43, 0x52, 0x43, 0x50, 0x43, 0x53, 0x43, 0x51, 0x43, 0x56, 0x43, 0x54, 0x43, 0x57, 0x43, 0x55, 0x43, 0xBC, 0x03, 0xB9, 0x43, 0xBA, 0x03, 0xBB, 0x03, 0xBC, 0x03, 0xBD, 0x43);
    vpatch(rom, 0x01a94,   3, 0x30, 0x36, 0x15);
    vpatch(rom, 0x12180, 128, 0x07, 0x1F, 0x0F, 0x1F, 0x1F, 0x1F, 0x1F, 0x1F, 0x03, 0x0F, 0x0F, 0x1F, 0x1F, 0x1F, 0x1F, 0x1F, 0x07, 0x07, 0x07, 0x0F, 0x0F, 0x02, 0x02, 0x00, 0x02, 0x01, 0x06, 0x0F, 0x0F, 0x07, 0x07, 0x07, 0x1F, 0x1F, 0x0F, 0x07, 0x0F, 0x1F, 0x1F, 0x3F, 0x2F, 0x27, 0x10, 0x07, 0x02, 0x02, 0x04, 0x04, 0xF8, 0xF8, 0xF0, 0xE0, 0xF0, 0xF8, 0xF8, 0xF8, 0xF0, 0xE4, 0x0C, 0xEC, 0x4C, 0x20, 0x20, 0x10, 0x78, 0x7C, 0xFC, 0x7C, 0x7C, 0xF8, 0x00, 0xF8, 0xF8, 0xF8, 0xFC, 0x88, 0xFC, 0xF8, 0xF8, 0x00, 0x07, 0x0F, 0x1F, 0x1F, 0x1A, 0x02, 0x01, 0x32, 0x07, 0x0F, 0x18, 0x07, 0x1F, 0x1F, 0x0F, 0x3F, 0x3F, 0x3F, 0x3F, 0x3F, 0x3F, 0x1F, 0x1E, 0x00, 0xFF, 0xFE, 0x7F, 0x02, 0x3F, 0x1F, 0x00, 0x00, 0xFC, 0xF8, 0xF0, 0xF0, 0xFC, 0xF8, 0x00, 0xF8, 0xFE, 0x7F, 0xFF, 0x4E, 0xFC, 0xF8, 0xF8, 0x00);
    vpatch(rom, 0x12220,  32, 0x07, 0x0F, 0x1F, 0x1F, 0x1F, 0x0F, 0x07, 0x38, 0x07, 0x0F, 0x1F, 0x07, 0x18, 0x1F, 0x0F, 0x3F, 0x0C, 0x18, 0x18, 0x18, 0x1C, 0x0F, 0x0F, 0x00, 0x0F, 0x1F, 0x1F, 0x07, 0x1F, 0x0F, 0x00, 0x00);
    vpatch(rom, 0x12260, 800, 0xE0, 0xF0, 0xE8, 0x80, 0xC0, 0x40, 0x00, 0x00, 0xE0, 0xF0, 0x48, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0x20, 0x20, 0x20, 0xE0, 0xE0, 0xE0, 0x00, 0xE0, 0xC0, 0xD8, 0xF8, 0x00, 0xE0, 0xE0, 0xC0, 0xE8, 0xF0, 0xE0, 0x80, 0xC0, 0x40, 0x00, 0x00, 0xE8, 0xF0, 0x40, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0x80, 0xFC, 0x1C, 0x00, 0xE0, 0x00, 0xE0, 0xF8, 0xF0, 0x3F, 0x3F, 0x3F, 0x3F, 0x3F, 0x1F, 0x1E, 0x00, 0x7F, 0xFF, 0xFF, 0xC0, 0x3F, 0x1F, 0x00, 0x00, 0xFC, 0xFC, 0xFC, 0xFC, 0xFC, 0xF8, 0x00, 0xF8, 0xFF, 0xFF, 0xFE, 0x00, 0xFC, 0xF8, 0xF8, 0x00, 0x07, 0x0F, 0x1F, 0x1F, 0x1F, 0x1E, 0x0F, 0x01, 0x07, 0x0F, 0x1F, 0x1C, 0x03, 0x1F, 0x0F, 0x07, 0xE0, 0xF0, 0xF8, 0xF8, 0xA0, 0x20, 0x10, 0xA0, 0xE0, 0xF0, 0x80, 0x78, 0xF0, 0xF8, 0xF0, 0xF0, 0x0E, 0x1E, 0x1E, 0x1F, 0x1F, 0x0F, 0x00, 0x0F, 0x0F, 0x1F, 0x1F, 0x00, 0x1F, 0x0F, 0x0F, 0x00, 0x48, 0x0C, 0x1C, 0xFC, 0xFC, 0xF8, 0x78, 0x80, 0xF8, 0xF8, 0xFC, 0x08, 0xFC, 0xF8, 0x80, 0x00, 0x2A, 0x1F, 0x2F, 0x3B, 0x2E, 0x0B, 0x0A, 0x18, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x0F, 0x0F, 0x3A, 0xFA, 0x3E, 0x33, 0xCC, 0x1F, 0x0F, 0x00, 0x0F, 0xF7, 0xFF, 0xFF, 0xC3, 0x1C, 0x0E, 0x1E, 0x0A, 0x1F, 0x0F, 0x1B, 0x0E, 0x0B, 0x1A, 0x38, 0x0A, 0x1F, 0x0F, 0x1F, 0x0F, 0x0F, 0x0F, 0x0F, 0x9A, 0x9A, 0x7E, 0x03, 0x0C, 0x1F, 0x01, 0x00, 0xEF, 0xF7, 0x7F, 0x0F, 0x03, 0x1C, 0x0E, 0x00, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x3F, 0x7F, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x00, 0x40, 0x7F, 0x7F, 0x3F, 0x0C, 0x1B, 0x0F, 0x07, 0x00, 0x60, 0x78, 0x3E, 0x0F, 0x1F, 0x0F, 0x07, 0x0E, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x0F, 0x3F, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x00, 0x00, 0x7F, 0xFF, 0x7F, 0x38, 0x17, 0x0F, 0x01, 0x00, 0x00, 0xF8, 0x7C, 0x7F, 0x1F, 0x0F, 0x0F, 0x00, 0x07, 0x0F, 0x1F, 0x1F, 0x3F, 0x3F, 0x3E, 0x3F, 0x07, 0x0D, 0x1E, 0x1D, 0x3F, 0x3F, 0x3F, 0x3F, 0xE0, 0xE0, 0xE0, 0xF0, 0xD0, 0x40, 0x40, 0x00, 0x40, 0x80, 0x60, 0xF0, 0xF0, 0xE0, 0xE0, 0xE0, 0x1F, 0x1C, 0x0E, 0x07, 0x0F, 0x1F, 0x1F, 0x3F, 0x1C, 0x1B, 0x01, 0x07, 0x02, 0x04, 0x04, 0x08, 0x00, 0x20, 0x60, 0xE0, 0xF0, 0xF0, 0xF8, 0xF8, 0xC0, 0xE0, 0x80, 0xE0, 0x40, 0x40, 0x20, 0x20, 0x1F, 0x1C, 0x0D, 0x04, 0x0C, 0x1F, 0x1F, 0x3F, 0x1C, 0x1B, 0x02, 0x07, 0x03, 0x02, 0x04, 0x04, 0x80, 0xE0, 0xE0, 0xE0, 0xF0, 0xF0, 0xF8, 0xF8, 0xC0, 0x60, 0x00, 0xE0, 0x40, 0x20, 0x20, 0x10, 0x07, 0x1F, 0x0F, 0x1E, 0x1E, 0x1A, 0x12, 0x18, 0x02, 0x0C, 0x03, 0x0F, 0x1F, 0x1F, 0x1F, 0x1F, 0xE0, 0xF8, 0xF0, 0xF8, 0xF8, 0x58, 0x48, 0x18, 0x40, 0x30, 0xC0, 0xF0, 0xF8, 0xF8, 0xF8, 0xF8, 0x2A, 0x1F, 0x6F, 0x7B, 0x6E, 0x4B, 0x4A, 0x58, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x0F, 0x0F, 0x7A, 0xFA, 0x3E, 0x33, 0xCC, 0x5F, 0x0F, 0x00, 0x0F, 0x17, 0xFF, 0xFF, 0xC3, 0x1C, 0x0E, 0x1E, 0x04, 0xE8, 0xFC, 0xB6, 0xF6, 0xD4, 0x50, 0x1E, 0x04, 0xE8, 0xFC, 0xF6, 0xF6, 0xFC, 0xF0, 0xF2, 0xD9, 0x59, 0x7E, 0xC0, 0x30, 0xF8, 0x80, 0x00, 0xF7, 0xEF, 0xFE, 0xF0, 0xC0, 0x38, 0x70, 0x00, 0x2A, 0x3F, 0x2F, 0x3B, 0x2E, 0x2B, 0x3A, 0x78, 0x0A, 0x1F, 0x0F, 0x1F, 0x0F, 0x0F, 0x0F, 0x0F, 0x9A, 0x9A, 0x7E, 0x23, 0x0C, 0x1F, 0x01, 0x00, 0xEF, 0xF7, 0x7F, 0x0F, 0x03, 0x1C, 0x0E, 0x00, 0x08, 0xE6, 0xF3, 0xB3, 0xF2, 0xD4, 0x50, 0x18, 0x08, 0xE6, 0xF3, 0xF3, 0xF2, 0xFC, 0xF0, 0xF0, 0xDC, 0x5E, 0x7F, 0xCC, 0x30, 0xF8, 0xF0, 0x00, 0xF0, 0xEA, 0xFF, 0xFF, 0xC3, 0x38, 0x70, 0x78, 0x2A, 0x3F, 0x2F, 0x3F, 0x2F, 0x2F, 0x3F, 0x7F, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x00, 0x40, 0x7F, 0x7F, 0x3F, 0x2C, 0x1B, 0x0F, 0x07, 0x00, 0x60, 0x78, 0x3E, 0x0F, 0x1F, 0x0F, 0x07, 0x0E, 0x08, 0xE6, 0xF3, 0xF3, 0xF2, 0xEC, 0xF8, 0xFE, 0x08, 0xE6, 0xF3, 0xF3, 0xF2, 0xFC, 0x00, 0x00, 0xFE, 0xFF, 0xFF, 0x13, 0xE8, 0xF0, 0x80, 0x00, 0x06, 0x0F, 0x3F, 0xF3, 0xFB, 0xF0, 0xF0, 0x00, 0x2A, 0x1F, 0x6F, 0x7F, 0x6F, 0x4F, 0x4F, 0x7F, 0x2A, 0x1F, 0x2F, 0x3F, 0x2F, 0x0F, 0x00, 0x00, 0x7F, 0xFF, 0x7F, 0x38, 0x57, 0x0F, 0x01, 0x00, 0x00, 0xF8, 0x7C, 0x7F, 0x1F, 0x0F, 0x0F, 0x00, 0x06, 0xE3, 0xF6, 0xF6, 0xF2, 0xEC, 0xF8, 0xFC, 0x06, 0xE3, 0xF6, 0xF6, 0xF2, 0xFC, 0x00, 0x00, 0xFE, 0xFE, 0xFC, 0x30, 0xD8, 0xF0, 0xE0, 0x00, 0x06, 0x1E, 0x7C, 0xF0, 0xF8, 0xF0, 0xE0, 0x70, 0x20, 0x17, 0x3F, 0x6F, 0x6E, 0x2E, 0x07, 0x0F, 0x20, 0x17, 0x3F, 0x6F, 0x6F, 0x3F, 0x07, 0x00, 0x1F, 0x3F, 0x3F, 0x38, 0x19, 0x0F, 0x07, 0x00, 0x0E, 0x1F, 0x3B, 0x37, 0x17, 0x07, 0x07, 0x03, 0x5A, 0xF6, 0xFA, 0xCA, 0xEA, 0xB2, 0xA2, 0x82, 0x58, 0xF4, 0xF8, 0xF8, 0xF8, 0xF0, 0xF0, 0xF0, 0xA7, 0xC8, 0xF8, 0x72, 0x80, 0xE0, 0xE0, 0x00, 0x70, 0x76, 0x56, 0x90, 0xE0, 0xE0, 0xE0, 0xC0, 0x10, 0x67, 0xCF, 0xCF, 0x4E, 0x2E, 0x07, 0x07, 0x10, 0x67, 0xCF, 0xCF, 0x4F, 0x3F, 0x07, 0x00, 0x0F, 0x1F, 0x1E, 0x0E, 0x0F, 0x0F, 0x07, 0x00, 0x06, 0x0F, 0x0D, 0x05, 0x0F, 0x0F, 0x1F, 0x0C, 0x58, 0xF4, 0xFC, 0xCC, 0xEC, 0xB4, 0xA4, 0x84, 0x58, 0xF4, 0xF8, 0xF8, 0xF8, 0xF0, 0xF0, 0xF0, 0xA4, 0xC4, 0x6E, 0x70, 0xF0, 0xF4, 0xF0, 0x00, 0x70, 0x70, 0xC0, 0x9C, 0xCC, 0xF0, 0xFC, 0x18);
    vpatch(rom, 0x12700,  16, 0x03, 0x07, 0x07, 0x07, 0x07, 0x06, 0x1A, 0x38, 0x01, 0x01, 0x05, 0x05, 0x00, 0x07, 0x1F, 0x1F);
    vpatch(rom, 0x12720,  16, 0xC0, 0xE0, 0xE0, 0xE0, 0xE0, 0x60, 0x58, 0x1C, 0x80, 0x80, 0xA0, 0xA0, 0x00, 0xE0, 0xF8, 0xFC);
    vpatch(rom, 0x12740,  16, 0x1C, 0x1F, 0x3F, 0x1F, 0x0F, 0x0F, 0x0F, 0x03, 0x6F, 0x6F, 0x27, 0x08, 0x0D, 0x08, 0x0D, 0x0D);
    vpatch(rom, 0x12760,  16, 0x3C, 0xFE, 0xFE, 0xFC, 0xF0, 0xF0, 0xC0, 0x00, 0xF8, 0xF8, 0xD2, 0x36, 0xF0, 0x70, 0xF8, 0x70);
    vpatch(rom, 0x12880,  64, 0x03, 0x07, 0x07, 0x07, 0x07, 0x06, 0x1A, 0x38, 0x01, 0x01, 0x05, 0x05, 0x00, 0x07, 0x1F, 0x3F, 0xC0, 0xE0, 0xE0, 0xE0, 0xE0, 0x60, 0x58, 0x1C, 0x80, 0x80, 0xA0, 0xA0, 0x00, 0xE0, 0xF8, 0xF8, 0x3C, 0x7F, 0x7F, 0x3F, 0x0F, 0x0F, 0x03, 0x00, 0x1F, 0x1F, 0x4B, 0x6C, 0x0F, 0x0E, 0x1F, 0x0E, 0x38, 0xF8, 0xFC, 0xF8, 0xF0, 0xF0, 0xF0, 0xC0, 0xF6, 0xF6, 0xE4, 0x10, 0xB0, 0x10, 0xB0, 0xB0);
    vpatch(rom, 0x12a20, 224, 0xFF, 0xFF, 0x7F, 0x0C, 0x1B, 0x0F, 0x07, 0x00, 0xE0, 0xF8, 0x7E, 0x0F, 0x1F, 0x0F, 0x07, 0x0E, 0xFE, 0xFF, 0xFF, 0x1F, 0xEF, 0xF0, 0x80, 0x00, 0x06, 0x0F, 0x3F, 0xF0, 0xF8, 0xF0, 0xF0, 0x00, 0x2A, 0x7F, 0xFF, 0xDF, 0xCF, 0x9F, 0xFF, 0xFF, 0x2A, 0x7F, 0xFF, 0xFF, 0xFF, 0xEF, 0x80, 0xC0, 0x08, 0xE6, 0xF3, 0xF3, 0xF2, 0xEC, 0xF8, 0xFE, 0x08, 0xE6, 0xF3, 0xF3, 0xF2, 0xFC, 0x00, 0x00, 0xFF, 0xFF, 0xFF, 0xF8, 0x57, 0x0F, 0x01, 0x00, 0x80, 0xF8, 0xFC, 0xFF, 0x5F, 0x0F, 0x0F, 0x00, 0xFE, 0xFF, 0xFF, 0x3E, 0xD8, 0xF0, 0xE0, 0x00, 0x06, 0x1E, 0x7C, 0xF0, 0xF8, 0xF0, 0xE0, 0x70, 0x2A, 0x7F, 0xFF, 0xDF, 0xCF, 0xDF, 0xFF, 0xFF, 0x2A, 0x7F, 0xFF, 0xFF, 0xFF, 0xEF, 0xC0, 0x80, 0x7E, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0x3C, 0x7E, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFA, 0xFC, 0xFF, 0xFF, 0xFF, 0xFF, 0x7E, 0x00, 0x67, 0xF7, 0xF5, 0x79, 0xFC, 0xFF, 0xFF, 0xC3, 0xFF, 0xFF, 0x9F, 0xFE, 0xFF, 0x00, 0x00, 0x00, 0xFF, 0x7E, 0x60, 0xFE, 0x00, 0x00, 0x00, 0x00, 0x06, 0xE3, 0xF6, 0xF6, 0xF2, 0xEC, 0xF8, 0xFC, 0x06, 0xE3, 0xF6, 0xF6, 0xF2, 0xFC, 0x00, 0x00, 0x7E, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0x3C, 0x7E, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFA, 0xFC, 0xFF, 0x87, 0xF8, 0xFE, 0x7E, 0x00, 0xE7, 0xF7, 0xB5, 0x79, 0x7F, 0x7E, 0x7E, 0x3C, 0xFF, 0xFF, 0xFF, 0xFE, 0xFE, 0xFF, 0x00, 0x00, 0xFF, 0x7E, 0x00, 0xFE, 0x00, 0x00, 0x00, 0x00);
    vpatch(rom, 0x12b20, 256, 0xFE, 0x78, 0x1F, 0x0F, 0x0F, 0x00, 0x03, 0x00, 0xE3, 0x67, 0x30, 0x18, 0x01, 0x03, 0x03, 0x00, 0x7E, 0x7F, 0xFF, 0x9F, 0xFF, 0x7E, 0xFE, 0x1E, 0xE3, 0xD1, 0x4C, 0xE2, 0xF2, 0x90, 0xA0, 0x1E, 0x3E, 0x7F, 0xFF, 0xFF, 0xFD, 0xF5, 0xE5, 0xF1, 0x34, 0x59, 0xE7, 0xDF, 0xFF, 0xFF, 0xFF, 0xFF, 0x42, 0xFC, 0xFE, 0x76, 0xDF, 0x7A, 0x4A, 0x03, 0x42, 0xFC, 0xFE, 0xFE, 0xFF, 0xFF, 0xFE, 0xFE, 0xFE, 0x78, 0x1F, 0x0F, 0x0F, 0x03, 0x00, 0x03, 0xE3, 0x67, 0x30, 0x18, 0x01, 0x00, 0x03, 0x03, 0x7E, 0x7F, 0xFF, 0x9F, 0xFF, 0xFE, 0x7C, 0xC0, 0xE3, 0xD9, 0x46, 0xF1, 0xE8, 0x08, 0x90, 0xC0, 0x40, 0xFD, 0xFF, 0x76, 0xDE, 0x7A, 0x4A, 0x03, 0x40, 0xFD, 0xFF, 0xFE, 0xFE, 0xFF, 0xFE, 0xFE, 0x05, 0x7F, 0xFF, 0xFC, 0xEE, 0x6B, 0x7A, 0x78, 0x05, 0x7F, 0xFF, 0xFF, 0xFF, 0xFF, 0x7F, 0x0F, 0xF3, 0xFF, 0xFF, 0x73, 0x03, 0x03, 0x03, 0x01, 0x9F, 0x0E, 0x09, 0x1E, 0x3E, 0x00, 0x00, 0x01, 0xFE, 0xFE, 0xFE, 0xFE, 0xFE, 0xFE, 0xFE, 0xE0, 0x82, 0x60, 0x10, 0x88, 0x48, 0x48, 0x4E, 0xE0, 0x7E, 0xFF, 0xFF, 0xF7, 0xF7, 0xCA, 0x8A, 0xC1, 0x24, 0x42, 0xBD, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0x05, 0x7F, 0xFF, 0xFC, 0xEE, 0xEB, 0x7A, 0xF8, 0x05, 0x7F, 0xFF, 0xFF, 0xFF, 0xFF, 0x7F, 0x0F, 0xF3, 0xFF, 0xFF, 0x73, 0x03, 0x03, 0x01, 0x00, 0x9F, 0x0E, 0x09, 0x1E, 0x3E, 0x00, 0x01, 0x00, 0xFE, 0xFE, 0xFE, 0xFE, 0xFE, 0xFE, 0xC0, 0x1E, 0x82, 0x70, 0x08, 0xC4, 0x24, 0x2E, 0xDE, 0x1E, 0x0E, 0x0F, 0x0F, 0x07, 0x0F, 0x1F, 0x1F, 0x3F, 0x33, 0x33, 0x10, 0x07, 0x02, 0x02, 0x04, 0x04, 0x78, 0xF8, 0xF0, 0xE0, 0xF0, 0xF8, 0xF8, 0xF8, 0xC0, 0xC4, 0x0C, 0xEC, 0x4C, 0x20, 0x20, 0x10);
    if (CUSTOM_SPELLS(rom)) {
        set_text(rom, 0x07e56, "Xian\xff"
                               "Huo \xff"
                               "YiXin\xff"
                               "Sha Du \xff"
                               " Ce Mian \xff"
                               "Suo Di \xff"
                               "GuiHui\xff"
                               "TuiLu\xff"
                               "Yin Xian\xff"
                               "Huo Shen\xff");
        set_text(rom, 0x08774, "TuiLu");
    }
}